

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortrclut_p.h
# Opt level: O2

QRgb __thiscall QColorTrcLut::fromLinear64(QColorTrcLut *this,QRgba64 rgb64)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  type puVar3;
  unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_> *this_00;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  
  uVar5 = (ushort)(rgb64.rgba >> 0x10);
  uVar6 = (ushort)(rgb64.rgba >> 0x20);
  uVar4 = (ushort)(rgb64.rgba >> 0x30);
  this_00 = &this->m_fromLinear;
  puVar3 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (this_00,(ulong)((ushort)((ushort)rgb64.rgba - ((ushort)rgb64.rgba >> 8)) >> 4)
                     );
  uVar1 = *puVar3;
  puVar3 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (this_00,(ulong)((ushort)(uVar5 - (uVar5 >> 8)) >> 4));
  uVar2 = *puVar3;
  puVar3 = std::unique_ptr<unsigned_short[],_std::default_delete<unsigned_short[]>_>::operator[]
                     (this_00,(ulong)((ushort)(uVar6 - (uVar6 >> 8)) >> 4));
  uVar7 = (uVar4 - (uVar4 >> 8)) + 0x80;
  uVar4 = (ushort)(*puVar3 + 0x80) >> 8;
  uVar5 = (ushort)(uVar2 + 0x80) >> 8;
  uVar6 = (ushort)(uVar1 + 0x80) >> 8;
  uVar8 = uVar7 >> 8;
  return CONCAT13((uVar8 != 0) * (uVar8 < 0x100) * (char)(uVar7 >> 8) - (0xff < uVar8),
                  CONCAT12((uVar6 != 0) * (uVar6 < 0x100) * (char)((ushort)(uVar1 + 0x80) >> 8) -
                           (0xff < uVar6),
                           CONCAT11((uVar5 != 0) * (uVar5 < 0x100) *
                                    (char)((ushort)(uVar2 + 0x80) >> 8) - (0xff < uVar5),
                                    (uVar4 != 0) * (uVar4 < 0x100) *
                                    (char)((ushort)(*puVar3 + 0x80) >> 8) - (0xff < uVar4))));
}

Assistant:

QRgb fromLinear64(QRgba64 rgb64) const
    {
#if defined(__SSE2__)
        __m128i v = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(&rgb64));
        v = _mm_sub_epi16(v, _mm_srli_epi16(v, 8));
        const __m128i vidx = _mm_srli_epi16(v, ShiftDown);
        const int ridx = _mm_extract_epi16(vidx, 0);
        const int gidx = _mm_extract_epi16(vidx, 1);
        const int bidx = _mm_extract_epi16(vidx, 2);
        v = _mm_insert_epi16(v, m_fromLinear[ridx], 2);
        v = _mm_insert_epi16(v, m_fromLinear[gidx], 1);
        v = _mm_insert_epi16(v, m_fromLinear[bidx], 0);
        v = _mm_add_epi16(v, _mm_set1_epi16(0x80));
        v = _mm_srli_epi16(v, 8);
        v = _mm_packus_epi16(v, v);
        return _mm_cvtsi128_si32(v);
#elif defined(__ARM_NEON__) && Q_BYTE_ORDER == Q_LITTLE_ENDIAN
        uint16x4_t v = vreinterpret_u16_u64(vmov_n_u64(rgb64));
        v = vsub_u16(v, vshr_n_u16(v, 8));
        const uint16x4_t vidx = vshr_n_u16(v, ShiftDown);
        const int ridx = vget_lane_u16(vidx, 0);
        const int gidx = vget_lane_u16(vidx, 1);
        const int bidx = vget_lane_u16(vidx, 2);
        v = vset_lane_u16(m_fromLinear[ridx], v, 2);
        v = vset_lane_u16(m_fromLinear[gidx], v, 1);
        v = vset_lane_u16(m_fromLinear[bidx], v, 0);
        uint8x8_t v8 = vrshrn_n_u16(vcombine_u16(v, v), 8);
        return vget_lane_u32(vreinterpret_u32_u8(v8), 0);
#else
        uint a = rgb64.alpha();
        uint r = rgb64.red();
        uint g = rgb64.green();
        uint b = rgb64.blue();
        a = a - (a >> 8);
        r = r - (r >> 8);
        g = g - (g >> 8);
        b = b - (b >> 8);
        a = (a + 0x80) >> 8;
        r = (m_fromLinear[r >> ShiftDown] + 0x80) >> 8;
        g = (m_fromLinear[g >> ShiftDown] + 0x80) >> 8;
        b = (m_fromLinear[b >> ShiftDown] + 0x80) >> 8;
        return (a << 24) | (r << 16) | (g << 8) | b;
#endif
    }